

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O1

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,short i)

{
  uint __val;
  uint6 in_register_00000032;
  ulong uVar1;
  uint uVar2;
  string __str;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  uVar2 = (uint)CONCAT62(in_register_00000032,i);
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  uVar2 = 1;
  if (((9 < __val) && (uVar2 = 2, 99 < __val)) && (uVar2 = 3, 999 < __val)) {
    uVar2 = 5 - (__val < 10000);
  }
  uVar1 = (((ulong)in_register_00000032 & 0x8000) << 0x10) >> 0x1f;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar2 + (char)uVar1);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)(uVar1 + (long)local_50),uVar2,__val);
  (*this->_vptr_Pipeline[2])(this,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(short i)
{
    this->writeString(std::to_string(i));
    return *this;
}